

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

bool __thiscall cmTarget::NeedRelinkBeforeInstall(cmTarget *this,string *config)

{
  cmMakefile *this_00;
  bool bVar1;
  ulong uVar2;
  bool local_103;
  allocator local_c1;
  undefined1 local_c0 [8];
  string flagVar;
  string ll;
  string local_78;
  allocator local_41;
  string local_40;
  string *local_20;
  string *config_local;
  cmTarget *this_local;
  
  if (((this->TargetTypeValue == EXECUTABLE) || (this->TargetTypeValue == SHARED_LIBRARY)) ||
     (this->TargetTypeValue == MODULE_LIBRARY)) {
    local_20 = config;
    config_local = (string *)this;
    bVar1 = GetHaveInstallRule(this);
    if (bVar1) {
      this_00 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_40,"CMAKE_SKIP_RPATH",&local_41);
      bVar1 = cmMakefile::IsOn(this_00,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      if (bVar1) {
        this_local._7_1_ = 0;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_78,"BUILD_WITH_INSTALL_RPATH",
                   (allocator *)(ll.field_2._M_local_buf + 0xf));
        bVar1 = GetPropertyAsBool(this,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::allocator<char>::~allocator((allocator<char> *)(ll.field_2._M_local_buf + 0xf));
        if (bVar1) {
          this_local._7_1_ = 0;
        }
        else {
          bVar1 = IsChrpathUsed(this,local_20);
          if (bVar1) {
            this_local._7_1_ = 0;
          }
          else {
            GetLinkerLanguage((string *)((long)&flagVar.field_2 + 8),this,local_20);
            uVar2 = std::__cxx11::string::empty();
            if ((uVar2 & 1) == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)local_c0,"CMAKE_SHARED_LIBRARY_RUNTIME_",&local_c1);
              std::allocator<char>::~allocator((allocator<char> *)&local_c1);
              std::__cxx11::string::operator+=
                        ((string *)local_c0,(string *)(flagVar.field_2._M_local_buf + 8));
              std::__cxx11::string::operator+=((string *)local_c0,"_FLAG");
              bVar1 = cmMakefile::IsSet(this->Makefile,(string *)local_c0);
              if (!bVar1) {
                this_local._7_1_ = 0;
              }
              std::__cxx11::string::~string((string *)local_c0);
              if (bVar1) {
                bVar1 = HaveBuildTreeRPATH(this,local_20);
                local_103 = true;
                if (!bVar1) {
                  local_103 = HaveInstallTreeRPATH(this);
                }
                this_local._7_1_ = local_103;
              }
            }
            else {
              this_local._7_1_ = 0;
            }
            std::__cxx11::string::~string((string *)(flagVar.field_2._M_local_buf + 8));
          }
        }
      }
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmTarget::NeedRelinkBeforeInstall(const std::string& config) const
{
  // Only executables and shared libraries can have an rpath and may
  // need relinking.
  if(this->TargetTypeValue != cmTarget::EXECUTABLE &&
     this->TargetTypeValue != cmTarget::SHARED_LIBRARY &&
     this->TargetTypeValue != cmTarget::MODULE_LIBRARY)
    {
    return false;
    }

  // If there is no install location this target will not be installed
  // and therefore does not need relinking.
  if(!this->GetHaveInstallRule())
    {
    return false;
    }

  // If skipping all rpaths completely then no relinking is needed.
  if(this->Makefile->IsOn("CMAKE_SKIP_RPATH"))
    {
    return false;
    }

  // If building with the install-tree rpath no relinking is needed.
  if(this->GetPropertyAsBool("BUILD_WITH_INSTALL_RPATH"))
    {
    return false;
    }

  // If chrpath is going to be used no relinking is needed.
  if(this->IsChrpathUsed(config))
    {
    return false;
    }

  // Check for rpath support on this platform.
  std::string ll = this->GetLinkerLanguage(config);
  if(!ll.empty())
    {
    std::string flagVar = "CMAKE_SHARED_LIBRARY_RUNTIME_";
    flagVar += ll;
    flagVar += "_FLAG";
    if(!this->Makefile->IsSet(flagVar))
      {
      // There is no rpath support on this platform so nothing needs
      // relinking.
      return false;
      }
    }
  else
    {
    // No linker language is known.  This error will be reported by
    // other code.
    return false;
    }

  // If either a build or install tree rpath is set then the rpath
  // will likely change between the build tree and install tree and
  // this target must be relinked.
  return this->HaveBuildTreeRPATH(config) || this->HaveInstallTreeRPATH();
}